

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void deqp::gls::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,
               char *nonFloatNamePrefix,char *checkVarName)

{
  bool bVar1;
  bool bVar2;
  DataType DVar3;
  Value *pVVar4;
  const_reference this;
  ostream *poVar5;
  Value *val;
  size_t ndx;
  bool isFirstOutput;
  char *checkVarName_local;
  char *nonFloatNamePrefix_local;
  ValueBlock *valueBlock_local;
  char *dstVec4Var_local;
  ostringstream *output_local;
  
  bVar1 = true;
  for (val = (Value *)0x0;
      pVVar4 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  (&valueBlock->outputs), val < pVVar4;
      val = (Value *)((long)&(val->type).m_type + 1)) {
    this = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                     (&valueBlock->outputs,(size_type)val);
    if ((checkVarName == (char *)0x0) || (bVar2 = std::operator!=(&this->name,checkVarName), !bVar2)
       ) {
      if (bVar1) {
        std::operator<<((ostream *)output,"bool RES = ");
        bVar1 = false;
      }
      else {
        std::operator<<((ostream *)output,"RES = RES && ");
      }
      DVar3 = glu::VarType::getBasicType(&this->type);
      DVar3 = glu::getDataTypeScalarType(DVar3);
      if (DVar3 == TYPE_FLOAT) {
        poVar5 = std::operator<<((ostream *)output,"isOk(");
        poVar5 = std::operator<<(poVar5,(string *)&this->name);
        poVar5 = std::operator<<(poVar5,", ref_");
        poVar5 = std::operator<<(poVar5,(string *)&this->name);
        std::operator<<(poVar5,", 0.05);\n");
      }
      else {
        poVar5 = std::operator<<((ostream *)output,"isOk(");
        poVar5 = std::operator<<(poVar5,nonFloatNamePrefix);
        poVar5 = std::operator<<(poVar5,(string *)&this->name);
        poVar5 = std::operator<<(poVar5,", ref_");
        poVar5 = std::operator<<(poVar5,(string *)&this->name);
        std::operator<<(poVar5,");\n");
      }
    }
  }
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)output,dstVec4Var);
    std::operator<<(poVar5," = vec4(1.0);\n");
  }
  else {
    poVar5 = std::operator<<((ostream *)output,dstVec4Var);
    std::operator<<(poVar5," = vec4(RES, RES, RES, 1.0);\n");
  }
  return;
}

Assistant:

static void genCompareOp (ostringstream& output, const char* dstVec4Var, const ValueBlock& valueBlock, const char* nonFloatNamePrefix, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (size_t ndx = 0; ndx < valueBlock.outputs.size(); ndx++)
	{
		const Value&	val		= valueBlock.outputs[ndx];

		// Check if we're only interested in one variable (then skip if not the right one).
		if (checkVarName && val.name != checkVarName)
			continue;

		// Prefix.
		if (isFirstOutput)
		{
			output << "bool RES = ";
			isFirstOutput = false;
		}
		else
			output << "RES = RES && ";

		// Generate actual comparison.
		if (getDataTypeScalarType(val.type.getBasicType()) == TYPE_FLOAT)
			output << "isOk(" << val.name << ", ref_" << val.name << ", 0.05);\n";
		else
			output << "isOk(" << nonFloatNamePrefix << val.name << ", ref_" << val.name << ");\n";
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n";	// \todo [petri] Should we give warning if not expect-failure case?
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}